

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateWorkgroupSizeAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  bool bVar1;
  BuiltIn operand;
  spv_result_t sVar2;
  spv_const_context psVar3;
  reference pEVar4;
  DiagnosticStream *pDVar5;
  AssemblyGrammar *this_00;
  mapped_type *this_01;
  BuiltInsValidator *local_428;
  code *local_420;
  undefined8 local_418;
  type local_410;
  value_type local_2c0;
  uint32_t local_29c;
  string local_298;
  char *local_278;
  string local_270;
  string local_250;
  DiagnosticStream local_230;
  ExecutionModel local_54;
  iterator iStack_50;
  ExecutionModel execution_model;
  iterator __end3;
  iterator __begin3;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range3;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  psVar3 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar3->target_env);
  if (bVar1) {
    __end3 = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::begin(&this->execution_models_);
    iStack_50 = std::
                set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                ::end(&this->execution_models_);
    while (bVar1 = std::operator!=(&__end3,&stack0xffffffffffffffb0), bVar1) {
      pEVar4 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end3);
      local_54 = *pEVar4;
      if ((((local_54 != ExecutionModelGLCompute) && (local_54 != ExecutionModelTaskNV)) &&
          (local_54 != ExecutionModelMeshNV)) &&
         ((local_54 != ExecutionModelTaskEXT && (local_54 != ExecutionModelMeshEXT)))) {
        ValidationState_t::diag(&local_230,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_250,this->_,0x1149,(char *)0x0);
        pDVar5 = DiagnosticStream::operator<<(&local_230,&local_250);
        psVar3 = ValidationState_t::context(this->_);
        spvLogStringForEnv_abi_cxx11_(&local_270,psVar3->target_env);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_270);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [22])0xf2c5e7);
        this_00 = ValidationState_t::grammar(this->_);
        operand = Decoration::builtin(decoration);
        local_278 = AssemblyGrammar::lookupOperandName(this_00,SPV_OPERAND_TYPE_BUILT_IN,operand);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_278);
        pDVar5 = DiagnosticStream::operator<<
                           (pDVar5,(char (*) [61])
                                   " to be used only with GLCompute, MeshNV, TaskNV, MeshEXT or ");
        pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [26])0xf2cf8d);
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  (&local_298,this,decoration,built_in_inst,referenced_inst,referenced_from_inst,
                   local_54);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_298);
        sVar2 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::~string((string *)&local_250);
        DiagnosticStream::~DiagnosticStream(&local_230);
        return sVar2;
      }
      std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end3);
    }
  }
  if (this->function_id_ == 0) {
    local_29c = val::Instruction::id(referenced_from_inst);
    this_01 = std::
              map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
              ::operator[](&this->id_to_at_reference_checks_,&local_29c);
    local_420 = ValidateWorkgroupSizeAtReference;
    local_418 = 0;
    local_428 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_410,(offset_in_BuiltInsValidator_to_subr *)&local_420,&local_428,decoration,
               built_in_inst,referenced_from_inst,(_Placeholder<1> *)&std::placeholders::_1);
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_2c0,&local_410);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(this_01,&local_2c0);
    std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_2c0);
    std::
    _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
    ::~_Bind(&local_410);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateWorkgroupSizeAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model != spv::ExecutionModel::GLCompute &&
          execution_model != spv::ExecutionModel::TaskNV &&
          execution_model != spv::ExecutionModel::MeshNV &&
          execution_model != spv::ExecutionModel::TaskEXT &&
          execution_model != spv::ExecutionModel::MeshEXT) {
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(4425)
               << spvLogStringForEnv(_.context()->target_env)
               << " spec allows BuiltIn "
               << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                                (uint32_t)decoration.builtin())
               << " to be used only with GLCompute, MeshNV, TaskNV, MeshEXT or "
               << "TaskEXT execution model. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(std::bind(
        &BuiltInsValidator::ValidateWorkgroupSizeAtReference, this, decoration,
        built_in_inst, referenced_from_inst, std::placeholders::_1));
  }

  return SPV_SUCCESS;
}